

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_ObjComputeLevelR(Acb_Ntk_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if ((iObj < 0) || ((p->vFanouts).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar3 = (p->vFanouts).pArray;
  uVar1 = pVVar3[(uint)iObj].nSize;
  iVar7 = 0;
  uVar5 = uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = 0;
  }
  if (0 < (int)uVar1) {
    uVar8 = 0;
    iVar6 = iVar7;
    do {
      iVar2 = pVVar3[(uint)iObj].pArray[uVar8];
      lVar9 = (long)iVar2;
      if (lVar9 < 1) goto LAB_0038404a;
      if ((p->vObjType).nSize <= iVar2) goto LAB_00384069;
      if ((p->vObjType).pArray[lVar9] != '\0') {
        if ((p->vLevelR).nSize <= iVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = (p->vLevelR).pArray[lVar9];
        bVar4 = iVar7 <= iVar2;
        iVar7 = iVar6;
        if (bVar4) {
          iVar7 = iVar2;
          iVar6 = iVar2;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  if (iObj != 0) {
    if (iObj < (p->vObjType).nSize) {
      if (iObj < (p->vLevelR).nSize) {
        iVar7 = iVar7 + (uint)((byte)((p->vObjType).pArray[(uint)iObj] - 5U) < 0xfe);
        (p->vLevelR).pArray[(uint)iObj] = iVar7;
        return iVar7;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
LAB_00384069:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
LAB_0038404a:
  __assert_fail("i>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjComputeLevelR( Acb_Ntk_t * p, int iObj )
{
    int iFanout, k, Level = 0;
    Acb_ObjForEachFanout( p, iObj, iFanout, k )
        Level = Abc_MaxInt( Level, Acb_ObjLevelR(p, iFanout) );
    return Acb_ObjSetLevelR( p, iObj, Level + !Acb_ObjIsCio(p, iObj) );
}